

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorText.cpp
# Opt level: O2

void __thiscall
Rml::DecoratorText::RenderElement
          (DecoratorText *this,Element *element,DecoratorDataHandle element_data)

{
  long lVar1;
  Vector2f VVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Texture texture;
  UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL> local_48;
  undefined1 local_38 [16];
  
  bVar3 = GenerateGeometry(this,element,(ElementData *)element_data);
  if (bVar3) {
    VVar2 = Element::GetAbsoluteOffset(element,Border);
    local_38._8_4_ = extraout_XMM0_Dc;
    local_38._0_4_ = VVar2.x;
    local_38._4_4_ = VVar2.y;
    local_38._12_4_ = extraout_XMM0_Dd;
    lVar5 = 0;
    for (uVar4 = 0; lVar1 = *(long *)(element_data + 8),
        uVar4 < (ulong)(*(long *)(element_data + 0x10) - lVar1 >> 5); uVar4 = uVar4 + 1) {
      local_48.render_manager = (RenderManager *)0x0;
      local_48.resource_handle = 0;
      texture._8_8_ = *(undefined8 *)(lVar1 + 0x18 + lVar5);
      texture.render_manager = *(RenderManager **)(lVar1 + 0x10 + lVar5);
      Geometry::Render((Geometry *)(lVar1 + lVar5),(Vector2f)local_38._0_8_,texture,
                       (CompiledShader *)&local_48);
      UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>::~UniqueRenderResource
                (&local_48);
      lVar5 = lVar5 + 0x20;
    }
  }
  return;
}

Assistant:

void DecoratorText::RenderElement(Element* element, DecoratorDataHandle element_data) const
{
	ElementData* data = reinterpret_cast<ElementData*>(element_data);
	if (!GenerateGeometry(element, *data))
		return;

	const Vector2f translation = element->GetAbsoluteOffset(BoxArea::Border);

	for (size_t i = 0; i < data->textured_geometry.size(); ++i)
		data->textured_geometry[i].geometry.Render(translation, data->textured_geometry[i].texture);
}